

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  string *psVar1;
  _func_int **pp_Var2;
  cmCPackLog *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  string BinCreatorOpt;
  string RepoGenOpt;
  ostringstream cmCPackLog_msg;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"CPACK_IFW_BINARYCREATOR_EXECUTABLE","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"CPACK_IFW_REPOGEN_EXECUTABLE","");
  bVar5 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1e8);
  if ((!bVar5) ||
     (bVar5 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1c8), !bVar5)) {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1e8);
  pcVar9 = "";
  if ((pcVar7 != (char *)0x0) && (bVar5 = cmSystemTools::IsNOTFOUND(pcVar7), !bVar5)) {
    strlen(pcVar7);
    pcVar9 = pcVar7;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->BinCreator,0,(char *)(this->BinCreator)._M_string_length,(ulong)pcVar9);
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
               ,0x5b);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_208._M_dataplus._M_p;
    sVar8 = strlen(local_208._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x119,_Var4._M_p,sVar8);
  }
  else {
    pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1c8);
    pcVar9 = "";
    if ((pcVar7 != (char *)0x0) && (bVar5 = cmSystemTools::IsNOTFOUND(pcVar7), !bVar5)) {
      strlen(pcVar7);
      pcVar9 = pcVar7;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->RepoGen,0,(char *)(this->RepoGen)._M_string_length,(ulong)pcVar9);
    pp_Var2 = (_func_int **)(local_1a8 + 0x10);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_FRAMEWORK_VERSION","");
    pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    pcVar7 = (char *)(this->FrameworkVersion)._M_string_length;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "1.9.9";
    }
    else {
      strlen(pcVar9);
    }
    std::__cxx11::string::_M_replace((ulong)&this->FrameworkVersion,0,pcVar7,(ulong)pcVar9);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES","");
    bVar5 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_1a8);
    this->ResolveDuplicateNames = bVar5;
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->PkgsDirsVector,
                      (this->PkgsDirsVector).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_PACKAGES_DIRECTORIES","");
    pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      sVar8 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar8);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&this->PkgsDirsVector,false);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
    (this->Installer).Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_DOWNLOAD_ALL","")
    ;
    pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_DOWNLOAD_ALL","");
      pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (pcVar9 != (char *)0x0) {
        bVar5 = cmSystemTools::IsOn(pcVar9);
        goto LAB_0024e3a0;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar5 = cmSystemTools::IsOn(pcVar9);
LAB_0024e3a0:
      this->OnlineOnly = bVar5;
    }
    if (((this->Installer).Repositories.
         super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->Installer).Repositories.
         super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      local_1a8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_EXECUTABLE_SUFFIX","");
      pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      psVar1 = &this->ExecutableSuffix;
      pcVar7 = (char *)(this->ExecutableSuffix)._M_string_length;
      if (pcVar9 == (char *)0x0) {
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,0x4ebc91);
      }
      else {
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,(ulong)pcVar9);
        if ((this->ExecutableSuffix)._M_string_length == 0) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_208,"CMAKE_SYSTEM_NAME","");
          pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_208);
          std::__cxx11::string::string((string *)local_1a8,pcVar9,&local_209);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          iVar6 = std::__cxx11::string::compare(local_1a8);
          if (iVar6 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar1,0,(char *)(this->ExecutableSuffix)._M_string_length,0x4ecf89);
          }
          if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
            operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
          }
        }
      }
      iVar6 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      goto LAB_0024e5f7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
               ,0x61);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_208._M_dataplus._M_p;
    sVar8 = strlen(local_208._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x158,_Var4._M_p,sVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar6 = 0;
LAB_0024e5f7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";

  if(!this->IsSet(BinCreatorOpt) ||
     !this->IsSet(RepoGenOpt))
    {
    this->ReadListFile("CPackIFW.cmake");
    }

  // Look 'binarycreator' executable (needs)

  const char *BinCreatorStr = this->GetOption(BinCreatorOpt);
  if(!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr))
    {
    BinCreator = "";
    }
  else
    {
    BinCreator = BinCreatorStr;
    }

  if (BinCreator.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find QtIFW compiler \"binarycreator\": "
                  "likely it is not installed, or not in your PATH"
                  << std::endl);
    return 0;
    }

  // Look 'repogen' executable (optional)

  const char *RepoGenStr = this->GetOption(RepoGenOpt);
  if(!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr))
    {
    RepoGen = "";
    }
  else
    {
    RepoGen = RepoGenStr;
    }

  // Framework version
  if(const char* FrameworkVersionSrt =
      this->GetOption("CPACK_IFW_FRAMEWORK_VERSION"))
    {
    FrameworkVersion = FrameworkVersionSrt;
    }
  else
    {
    FrameworkVersion = "1.9.9";
    }

  // Variables that Change Behavior

  // Resolve duplicate names
  ResolveDuplicateNames = this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  PkgsDirsVector.clear();
  if(const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES"))
    {
    cmSystemTools::ExpandListArgument(dirs,
                                      PkgsDirsVector);
    }

  // Installer
  Installer.Generator = this;
  Installer.ConfigureFromOptions();

  if (const char* ifwDownloadAll =
      this->GetOption("CPACK_IFW_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
    }
  else if (const char* cpackDownloadAll =
           this->GetOption("CPACK_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
    }
  else
    {
    OnlineOnly = false;
    }

  if (!Installer.Repositories.empty() && RepoGen.empty()) {
  cmCPackLogger(cmCPackLog::LOG_ERROR,
                "Cannot find QtIFW repository generator \"repogen\": "
                "likely it is not installed, or not in your PATH"
                << std::endl);
  return 0;
  }

  // Executable suffix
  if(const char *optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX"))
    {
    ExecutableSuffix = optExeSuffix;
    if(ExecutableSuffix.empty())
      {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if(sysName == "Linux")
        {
        ExecutableSuffix = ".run";
        }
      }
    }
  else
    {
    ExecutableSuffix = cmCPackGenerator::GetOutputExtension();
    }

  return this->Superclass::InitializeInternal();
}